

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefileCurrent::~cmMakefileCurrent(cmMakefileCurrent *this)

{
  cmGlobalGenerator *pcVar1;
  cmake *pcVar2;
  cmState *pcVar3;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar4;
  
  cmFileLockPool::PopFileScope(&this->GG->FileLockPool);
  pcVar1 = this->GG;
  pcVar1->CurrentMakefile = this->MF;
  pcVar2 = pcVar1->CMakeInstance;
  pcVar3 = (this->Snapshot).State;
  pcVar4 = (this->Snapshot).Position.Tree;
  (pcVar2->CurrentSnapshot).Position.Position = (this->Snapshot).Position.Position;
  (pcVar2->CurrentSnapshot).State = pcVar3;
  (pcVar2->CurrentSnapshot).Position.Tree = pcVar4;
  return;
}

Assistant:

~cmMakefileCurrent()
    {
#if defined(CMAKE_BUILD_WITH_CMAKE)
    this->GG->GetFileLockPool().PopFileScope();
#endif
    this->GG->SetCurrentMakefile(this->MF);
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
    }